

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_schema_hash
                 (lyd_lyb_ctx *lybctx,lysc_node *sparent,lys_module *mod,lysc_node **snode)

{
  ly_bool lVar1;
  int iVar2;
  lysc_module *local_70;
  uint8_t local_4d;
  LY_ERR ret__;
  uint8_t local_47 [2];
  uint8_t hash_count;
  uint32_t getnext_opts;
  lysc_node *plStack_40;
  uint8_t hash [7];
  lysc_node *sibling;
  LY_ERR ret;
  lysc_node **snode_local;
  lys_module *mod_local;
  lysc_node *sparent_local;
  lyd_lyb_ctx *lybctx_local;
  
  *snode = (lysc_node *)0x0;
  lybctx_local._4_4_ = lyb_read_hashes(lybctx->lybctx,local_47,&local_4d);
  if (lybctx_local._4_4_ == LY_SUCCESS) {
    if (local_47[0] == '\0') {
      lybctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      ret__ = LY_SUCCESS;
      if ((lybctx->int_opts & 4) != 0) {
        ret__ = 0x10;
      }
      plStack_40 = (lysc_node *)0x0;
      do {
        if ((sparent == (lysc_node *)0x0) && (lybctx->ext != (lysc_ext_instance *)0x0)) {
          plStack_40 = lys_getnext_ext(plStack_40,(lysc_node *)0x0,lybctx->ext,ret__);
        }
        else {
          if (mod == (lys_module *)0x0) {
            local_70 = (lysc_module *)0x0;
          }
          else {
            local_70 = mod->compiled;
          }
          plStack_40 = lys_getnext(plStack_40,sparent,local_70,ret__);
        }
      } while ((plStack_40 != (lysc_node *)0x0) &&
              (((plStack_40->module->ctx == lybctx->lybctx->ctx &&
                (lVar1 = lyb_has_schema_model(plStack_40,lybctx->lybctx->models), lVar1 == '\0')) ||
               (iVar2 = lyb_is_schema_hash_match(plStack_40,local_47,local_4d), iVar2 == 0))));
      if ((plStack_40 == (lysc_node *)0x0) &&
         (((lybctx->field_1).field_0.parse_opts & 0x20000) != 0)) {
        if (lybctx->ext == (lysc_ext_instance *)0x0) {
          if (mod == (lys_module *)0x0) {
            ly_vlog(lybctx->lybctx->ctx,(char *)0x0,LYVE_REFERENCE,
                    "Failed to find matching hash for a child node of \"%s\".",sparent->name);
          }
          else {
            ly_vlog(lybctx->lybctx->ctx,(char *)0x0,LYVE_REFERENCE,
                    "Failed to find matching hash for a top-level node from \"%s\".",mod->name);
          }
        }
        else {
          ly_vlog(lybctx->lybctx->ctx,(char *)0x0,LYVE_REFERENCE,
                  "Failed to find matching hash for a node from \"%s\" extension instance node.",
                  lybctx->ext->def->name);
        }
        lybctx_local._4_4_ = LY_EVALID;
      }
      else if ((plStack_40 == (lysc_node *)0x0) ||
              (lybctx_local._4_4_ = lyd_parser_check_schema((lyd_ctx *)lybctx,plStack_40),
              lybctx_local._4_4_ == LY_SUCCESS)) {
        *snode = plStack_40;
        lybctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return lybctx_local._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_schema_hash(struct lyd_lyb_ctx *lybctx, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_node **snode)
{
    LY_ERR ret;
    const struct lysc_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];
    uint32_t getnext_opts;
    uint8_t hash_count;

    *snode = NULL;

    ret = lyb_read_hashes(lybctx->lybctx, hash, &hash_count);
    LY_CHECK_RET(ret);

    if (!hash[0]) {
        /* opaque node */
        return LY_SUCCESS;
    }

    getnext_opts = lybctx->int_opts & LYD_INTOPT_REPLY ? LYS_GETNEXT_OUTPUT : 0;

    /* find our node with matching hashes */
    sibling = NULL;
    while (1) {
        if (!sparent && lybctx->ext) {
            sibling = lys_getnext_ext(sibling, sparent, lybctx->ext, getnext_opts);
        } else {
            sibling = lys_getnext(sibling, sparent, mod ? mod->compiled : NULL, getnext_opts);
        }
        if (!sibling) {
            break;
        }
        /* skip schema nodes from models not present during printing */
        if (((sibling->module->ctx != lybctx->lybctx->ctx) || lyb_has_schema_model(sibling, lybctx->lybctx->models)) &&
                lyb_is_schema_hash_match((struct lysc_node *)sibling, hash, hash_count)) {
            /* match found */
            break;
        }
    }

    if (!sibling && (lybctx->parse_opts & LYD_PARSE_STRICT)) {
        if (lybctx->ext) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a node from \"%s\" extension instance node.",
                    lybctx->ext->def->name);
        } else if (mod) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a top-level node"
                    " from \"%s\".", mod->name);
        } else {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a child node"
                    " of \"%s\".", sparent->name);
        }
        return LY_EVALID;
    } else if (sibling && (ret = lyd_parser_check_schema((struct lyd_ctx *)lybctx, sibling))) {
        return ret;
    }

    *snode = sibling;
    return LY_SUCCESS;
}